

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::makeBlurEffectIfNeeded(AbstractScrollAreaPrivate *this)

{
  QPoint QVar1;
  BlurEffect *pBVar2;
  long lVar3;
  QSize QVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  double dVar17;
  QRect QVar18;
  int local_38;
  
  if (this->horBlur->policy == BlurAlwaysOff) {
    normalizePosition(this);
    return;
  }
  QVar18 = QWidget::rect(this->viewport);
  QVar1 = this->topLeftCorner;
  normalizePosition(this);
  QVar4 = QWidget::size(this->viewport);
  iVar10 = (this->scrolledAreaSize).wd - QVar4.wd;
  iVar13 = (this->scrolledAreaSize).ht;
  pBVar2 = this->horBlur;
  iVar11 = pBVar2->pressure;
  iVar14 = QVar1.xp;
  iVar15 = QVar18.x1;
  iVar12 = QVar18.y1;
  iVar6 = QVar18.y2;
  if ((iVar14 < 0) || ((iVar11 < 0 && (iVar14 <= iVar10)))) {
    iVar5 = iVar11 + iVar14;
    iVar7 = 0;
    if (0 < iVar11 || iVar5 < 1) {
      iVar9 = -iVar5;
      if (0 < iVar5) {
        iVar9 = iVar5;
      }
      dVar17 = pBVar2->maxPressure;
      iVar7 = iVar5;
      if (dVar17 < (double)iVar9) {
        if (iVar11 < 0) {
          dVar17 = -dVar17;
        }
        iVar7 = (int)dVar17;
      }
    }
    pBVar2->pressure = iVar7;
    lVar3 = *(long *)&pBVar2->field_0x20;
    bVar16 = *(QWidget **)(*(long *)&pBVar2->field_0x8 + 0x10) == this->viewport;
    iVar11 = (this->topLeftCorner).xp;
    if (bVar16) {
      iVar11 = iVar15;
    }
    iVar7 = (this->topLeftCorner).yp;
    if (bVar16) {
      iVar7 = iVar12;
    }
    QWidget::move(&pBVar2->super_QWidget,
                  iVar11 + ((*(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14)) + 1) / -2,
                  iVar7 + (((iVar6 - iVar12) - *(int *)(lVar3 + 0x20)) + *(int *)(lVar3 + 0x18)) / 2
                 );
  }
  iVar13 = iVar13 - QVar4.ht;
  pBVar2 = this->vertBlur;
  iVar11 = pBVar2->pressure;
  iVar7 = QVar18.x2;
  local_38 = QVar1.yp;
  if (((long)QVar1 < 0) || ((iVar11 < 0 && (local_38 <= iVar13)))) {
    iVar5 = local_38 + iVar11;
    if ((0 < iVar11) || (iVar9 = 0, iVar5 < 1)) {
      iVar8 = -iVar5;
      if (0 < iVar5) {
        iVar8 = iVar5;
      }
      dVar17 = pBVar2->maxPressure;
      iVar9 = iVar5;
      if (dVar17 < (double)iVar8) {
        if (iVar11 < 0) {
          dVar17 = -dVar17;
        }
        iVar9 = (int)dVar17;
      }
    }
    pBVar2->pressure = iVar9;
    lVar3 = *(long *)&pBVar2->field_0x20;
    bVar16 = *(QWidget **)(*(long *)&pBVar2->field_0x8 + 0x10) == this->viewport;
    iVar11 = (this->topLeftCorner).xp;
    if (bVar16) {
      iVar11 = iVar15;
    }
    iVar5 = iVar12;
    if (!bVar16) {
      iVar5 = (this->topLeftCorner).yp;
    }
    QWidget::move(&pBVar2->super_QWidget,
                  iVar11 + (((iVar7 - iVar15) - *(int *)(lVar3 + 0x1c)) + *(int *)(lVar3 + 0x14)) /
                           2,iVar5 + ((*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18)) + 1) / -2);
  }
  pBVar2 = this->horBlur;
  iVar11 = pBVar2->pressure;
  if ((iVar14 - iVar10 != 0 && iVar10 <= iVar14) || (0 < iVar14 && 0 < iVar11)) {
    if ((iVar11 < 0) || (iVar5 = 0, iVar10 <= iVar11 + iVar14)) {
      iVar5 = (iVar14 - iVar10) + iVar11;
      iVar10 = -iVar5;
      if (0 < iVar5) {
        iVar10 = iVar5;
      }
      dVar17 = pBVar2->maxPressure;
      if (dVar17 < (double)iVar10) {
        if (iVar11 < 0) {
          dVar17 = -dVar17;
        }
        iVar5 = (int)dVar17;
      }
    }
    pBVar2->pressure = iVar5;
    lVar3 = *(long *)&pBVar2->field_0x20;
    bVar16 = *(QWidget **)(*(long *)&pBVar2->field_0x8 + 0x10) == this->viewport;
    iVar11 = (this->topLeftCorner).xp;
    if (bVar16) {
      iVar11 = iVar15;
    }
    iVar10 = (this->topLeftCorner).yp;
    if (bVar16) {
      iVar10 = iVar12;
    }
    QWidget::move(&pBVar2->super_QWidget,
                  ((*(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14)) + 1) / -2 +
                  iVar11 + (iVar7 - iVar15) + 1,
                  iVar10 + (((iVar6 - iVar12) - *(int *)(lVar3 + 0x20)) + *(int *)(lVar3 + 0x18)) /
                           2);
  }
  pBVar2 = this->vertBlur;
  iVar11 = pBVar2->pressure;
  if ((local_38 - iVar13 != 0 && iVar13 <= local_38) || (0 < local_38 && 0 < iVar11)) {
    if ((iVar11 < 0) || (iVar10 = 0, iVar13 <= local_38 + iVar11)) {
      iVar10 = (local_38 - iVar13) + iVar11;
      iVar13 = -iVar10;
      if (0 < iVar10) {
        iVar13 = iVar10;
      }
      dVar17 = pBVar2->maxPressure;
      if (dVar17 < (double)iVar13) {
        if (iVar11 < 0) {
          dVar17 = -dVar17;
        }
        iVar10 = (int)dVar17;
      }
    }
    pBVar2->pressure = iVar10;
    lVar3 = *(long *)&pBVar2->field_0x20;
    bVar16 = *(QWidget **)(*(long *)&pBVar2->field_0x8 + 0x10) == this->viewport;
    iVar13 = (this->topLeftCorner).xp;
    if (bVar16) {
      iVar13 = iVar15;
    }
    iVar11 = (this->topLeftCorner).yp;
    if (bVar16) {
      iVar11 = iVar12;
    }
    QWidget::move(&pBVar2->super_QWidget,
                  iVar13 + (((iVar7 - iVar15) - *(int *)(lVar3 + 0x1c)) + *(int *)(lVar3 + 0x14)) /
                           2,
                  ((*(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18)) + 1) / -2 +
                  (iVar6 - iVar12) + iVar11 + 1);
  }
  if (this->horBlur->pressure == 0) {
    QWidget::hide();
  }
  else {
    QWidget::raise();
    QWidget::show();
    QWidget::update();
  }
  if (this->vertBlur->pressure != 0) {
    QWidget::raise();
    QWidget::show();
    QWidget::update();
    return;
  }
  QWidget::hide();
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::makeBlurEffectIfNeeded()
{
	if( horBlur->policy != AbstractScrollArea::BlurAlwaysOff )
	{
		const QRect r = viewport->rect();

		const QPoint p = topLeftCorner;

		normalizePosition();

		const QSize s = viewport->size();

		const QPoint maxPos = QPoint( scrolledAreaSize.width() - s.width(),
			scrolledAreaSize.height() - s.height() );

		if( p.x() < 0 || ( horBlur->pressure < 0 && maxPos.x() >= p.x() ) )
		{
			if( horBlur->pressure <= 0 && horBlur->pressure + p.x() > 0 )
				horBlur->pressure = 0;
			else if( qAbs( horBlur->pressure + p.x() ) > horBlur->maxPressure )
				horBlur->pressure = ( horBlur->pressure < 0 ?
					- horBlur->maxPressure : horBlur->maxPressure );
			else
				horBlur->pressure += p.x();

			horBlur->move(
				( horBlur->parent() == viewport ? r.x() : topLeftCorner.x() )
					- horBlur->width() / 2,
				( horBlur->parent() == viewport ? r.y() : topLeftCorner.y() )
					+ ( r.height() - horBlur->height() ) / 2 );
		}

		if( p.y() < 0 || ( vertBlur->pressure < 0 && maxPos.y() >= p.y() ) )
		{
			if( vertBlur->pressure <= 0 && vertBlur->pressure + p.y() > 0 )
				vertBlur->pressure = 0;
			else if( qAbs( vertBlur->pressure + p.y() ) > vertBlur->maxPressure )
				vertBlur->pressure = ( vertBlur->pressure < 0 ?
					- vertBlur->maxPressure : vertBlur->maxPressure );
			else
				vertBlur->pressure += p.y();

			vertBlur->move(
				( vertBlur->parent() == viewport ? r.x() : topLeftCorner.x() )
					+ ( r.width() - vertBlur->width() ) / 2,
				( vertBlur->parent() == viewport ? r.y() : topLeftCorner.y() )
					- vertBlur->height() / 2 );
		}

		if( maxPos.x() < p.x() || ( horBlur->pressure > 0 && p.x() > 0 ) )
		{
			if( horBlur->pressure >= 0 &&
				horBlur->pressure + p.x() - maxPos.x() < 0 )
					horBlur->pressure = 0;
			else if( qAbs( horBlur->pressure + p.x() - maxPos.x() ) > horBlur->maxPressure )
				horBlur->pressure = ( horBlur->pressure < 0 ?
					- horBlur->maxPressure : horBlur->maxPressure );
			else
				horBlur->pressure += ( p.x() - maxPos.x() );

			horBlur->move(
				( horBlur->parent() == viewport ? r.x() : topLeftCorner.x() )
					+ r.width() - horBlur->width() / 2,
				( horBlur->parent() == viewport ? r.y() : topLeftCorner.y() )
					+ ( r.height() - horBlur->height() ) / 2 );
		}

		if( maxPos.y() < p.y() || ( vertBlur->pressure > 0 && p.y() > 0 ) )
		{
			if( vertBlur->pressure >= 0 &&
				vertBlur->pressure + p.y() - maxPos.y() < 0 )
					vertBlur->pressure = 0;
			else if( qAbs( vertBlur->pressure + p.y() - maxPos.y() ) > vertBlur->maxPressure )
				vertBlur->pressure = ( vertBlur->pressure < 0 ?
					- vertBlur->maxPressure : vertBlur->maxPressure );
			else
				vertBlur->pressure += ( p.y() - maxPos.y() );

			vertBlur->move(
				( vertBlur->parent() == viewport ? r.x() : topLeftCorner.x() )
					+ ( r.width() - vertBlur->width() ) / 2,
				( vertBlur->parent() == viewport ? r.y() : topLeftCorner.y() )
					+ r.height() - vertBlur->height() / 2 );
		}

		if( horBlur->pressure != 0 )
		{
			horBlur->raise();
			horBlur->show();
			horBlur->update();
		}
		else
			horBlur->hide();

		if( vertBlur->pressure != 0 )
		{
			vertBlur->raise();
			vertBlur->show();
			vertBlur->update();
		}
		else
			vertBlur->hide();
	}
	else
		normalizePosition();
}